

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_rowcol_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  int *piVar3;
  __m256i alVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  int iVar12;
  int iVar13;
  ulong size;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  long lVar20;
  __m256i *palVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  __m256i_64_t e;
  __m256i_64_t h;
  longlong local_a0 [4];
  longlong local_80 [10];
  undefined1 auVar39 [32];
  undefined1 auVar60 [64];
  undefined1 auVar95 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_rowcol_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar1 = (profile->profile64).score;
    if (pvVar1 == (void *)0x0) {
      parasail_nw_rowcol_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_nw_rowcol_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar23 = profile->s1Len;
        if ((int)uVar23 < 1) {
          parasail_nw_rowcol_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_rowcol_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_rowcol_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_nw_rowcol_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_rowcol_scan_profile_avx2_256_64_cold_1();
        }
        else {
          iVar22 = uVar23 - 1;
          size = (ulong)uVar23 + 3 >> 2;
          iVar12 = (int)size;
          iVar8 = iVar22 / iVar12;
          uVar25 = CONCAT44(0,open);
          iVar32 = -open;
          iVar13 = ppVar2->min;
          uVar24 = 0x8000000000000000 - (long)iVar13;
          if (iVar13 != iVar32 && SBORROW4(iVar13,iVar32) == iVar13 + open < 0) {
            uVar24 = uVar25 | 0x8000000000000000;
          }
          iVar13 = ppVar2->max;
          ppVar11 = parasail_result_new_rowcol1((uint)((ulong)uVar23 + 3) & 0x7ffffffc,s2Len);
          if (ppVar11 != (parasail_result_t *)0x0) {
            ppVar11->flag = ppVar11->flag | 0x4840401;
            ptr = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            if (ptr_03 != (__m256i *)0x0 &&
                ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
              iVar9 = s2Len + -1;
              iVar10 = 3 - iVar8;
              auVar49._8_4_ = open;
              auVar49._0_8_ = uVar25;
              auVar49._12_4_ = 0;
              auVar49._16_4_ = open;
              auVar49._20_4_ = 0;
              auVar49._24_4_ = open;
              auVar49._28_4_ = 0;
              uVar14 = CONCAT44(0,gap);
              auVar50._8_4_ = gap;
              auVar50._0_8_ = uVar14;
              auVar50._12_4_ = 0;
              auVar50._16_4_ = gap;
              auVar50._20_4_ = 0;
              auVar50._24_4_ = gap;
              auVar50._28_4_ = 0;
              uVar24 = uVar24 + 1;
              lVar20 = 0x7ffffffffffffffe - (long)iVar13;
              auVar38._8_8_ = uVar24;
              auVar38._0_8_ = uVar24;
              auVar39._16_8_ = uVar24;
              auVar39._0_16_ = auVar38;
              auVar39._24_8_ = uVar24;
              auVar58._8_8_ = lVar20;
              auVar58._0_8_ = lVar20;
              auVar58._16_8_ = lVar20;
              auVar58._24_8_ = lVar20;
              auVar60 = ZEXT3264(auVar58);
              lVar20 = (long)-(gap * iVar12);
              auVar51._8_8_ = lVar20;
              auVar51._0_8_ = lVar20;
              auVar51._16_8_ = lVar20;
              auVar51._24_8_ = lVar20;
              auVar51 = vpblendd_avx2(auVar51,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar51 = vpaddq_avx2(ZEXT832(uVar24),auVar51);
              lVar20 = (long)iVar32;
              uVar27 = 0;
              do {
                lVar30 = 0;
                lVar29 = lVar20;
                do {
                  local_80[lVar30] = lVar29;
                  local_a0[lVar30] = lVar29 - uVar25;
                  lVar30 = lVar30 + 1;
                  lVar29 = lVar29 - size * uVar14;
                } while (lVar30 != 4);
                palVar21 = ptr_02 + uVar27;
                (*palVar21)[0] = local_80[0];
                (*palVar21)[1] = local_80[1];
                (*palVar21)[2] = local_80[2];
                (*palVar21)[3] = local_80[3];
                palVar21 = ptr + uVar27;
                (*palVar21)[0] = local_a0[0];
                (*palVar21)[1] = local_a0[1];
                (*palVar21)[2] = local_a0[2];
                (*palVar21)[3] = local_a0[3];
                uVar27 = uVar27 + 1;
                lVar20 = lVar20 - uVar14;
              } while (uVar27 != size);
              *ptr_00 = 0;
              lVar20 = (long)iVar32;
              uVar25 = 1;
              do {
                ptr_00[uVar25] = lVar20;
                uVar25 = uVar25 + 1;
                lVar20 = lVar20 - uVar14;
              } while (s2Len + 1 != uVar25);
              alVar4 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar49);
              palVar21 = ptr_03 + (iVar12 - 1U);
              uVar25 = size;
              do {
                *palVar21 = alVar4;
                alVar4 = (__m256i)vpsubq_avx2((undefined1  [32])alVar4,auVar50);
                palVar21 = palVar21 + -1;
                iVar13 = (int)uVar25;
                uVar23 = iVar13 - 1;
                uVar25 = (ulong)uVar23;
              } while (uVar23 != 0 && 0 < iVar13);
              iVar13 = 1;
              if (1 < iVar10) {
                iVar13 = iVar10;
              }
              uVar25 = 1;
              if (1 < s2Len) {
                uVar25 = (ulong)(uint)s2Len;
              }
              lVar20 = (ulong)(iVar12 + (uint)(iVar12 == 0)) << 5;
              auVar55 = ZEXT3264(auVar39);
              uVar14 = 0;
              do {
                auVar61 = SUB3216(ptr_02[iVar12 - 1U],0);
                auVar74._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar38;
                auVar74._16_16_ = ZEXT116(0) * auVar39._16_16_ + ZEXT116(1) * auVar61;
                auVar74 = vpalignr_avx2((undefined1  [32])ptr_02[iVar12 - 1U],auVar74,8);
                auVar74 = vpblendd_avx2(auVar74,ZEXT832((ulong)ptr_00[uVar14]),3);
                iVar32 = ppVar2->mapper[(byte)s2[uVar14]];
                auVar86 = vpsubq_avx2(auVar39,(undefined1  [32])*ptr_03);
                lVar29 = 0;
                auVar75 = auVar39;
                do {
                  auVar95 = vpaddq_avx2(auVar74,*(undefined1 (*) [32])
                                                 ((long)pvVar1 + lVar29 + (long)iVar32 * size * 0x20
                                                 ));
                  auVar74 = *(undefined1 (*) [32])((long)*ptr_02 + lVar29);
                  auVar46 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar29),auVar50);
                  auVar65 = vpsubq_avx2(auVar74,auVar49);
                  uVar27 = auVar65._0_8_;
                  if ((long)auVar65._0_8_ < (long)auVar46._0_8_) {
                    uVar27 = auVar46._0_8_;
                  }
                  uVar15 = vpextrq_avx(auVar46._0_16_,1);
                  uVar28 = vpextrq_avx(auVar65._0_16_,1);
                  if ((long)uVar28 < (long)uVar15) {
                    uVar28 = uVar15;
                  }
                  uVar15 = auVar65._16_8_;
                  if ((long)auVar65._16_8_ < (long)auVar46._16_8_) {
                    uVar15 = auVar46._16_8_;
                  }
                  uVar16 = vpextrq_avx(auVar46._16_16_,1);
                  uVar33 = vpextrq_avx(auVar65._16_16_,1);
                  if ((long)uVar33 < (long)uVar16) {
                    uVar33 = uVar16;
                  }
                  auVar86 = vpaddq_avx2(auVar86,*(undefined1 (*) [32])((long)*ptr_03 + lVar29));
                  uVar16 = auVar86._0_8_;
                  if ((long)auVar86._0_8_ < (long)auVar75._0_8_) {
                    uVar16 = auVar75._0_8_;
                  }
                  uVar17 = vpextrq_avx(auVar75._0_16_,1);
                  uVar31 = vpextrq_avx(auVar86._0_16_,1);
                  if ((long)uVar31 < (long)uVar17) {
                    uVar31 = uVar17;
                  }
                  uVar17 = auVar86._16_8_;
                  if ((long)auVar86._16_8_ < (long)auVar75._16_8_) {
                    uVar17 = auVar75._16_8_;
                  }
                  uVar35 = vpextrq_avx(auVar75._16_16_,1);
                  uVar18 = vpextrq_avx(auVar86._16_16_,1);
                  if ((long)uVar18 < (long)uVar35) {
                    uVar18 = uVar35;
                  }
                  uVar35 = uVar27;
                  if ((long)uVar27 <= (long)auVar95._0_8_) {
                    uVar35 = auVar95._0_8_;
                  }
                  uVar36 = vpextrq_avx(auVar95._0_16_,1);
                  uVar26 = uVar28;
                  if ((long)uVar28 <= (long)uVar36) {
                    uVar26 = uVar36;
                  }
                  uVar36 = uVar15;
                  if ((long)uVar15 <= (long)auVar95._16_8_) {
                    uVar36 = auVar95._16_8_;
                  }
                  uVar37 = vpextrq_avx(auVar95._16_16_,1);
                  uVar34 = uVar33;
                  if ((long)uVar33 <= (long)uVar37) {
                    uVar34 = uVar37;
                  }
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = uVar27;
                  auVar92._8_8_ = 0;
                  auVar92._0_8_ = uVar28;
                  auVar61 = vpunpcklqdq_avx(auVar61,auVar92);
                  auVar77._8_8_ = 0;
                  auVar77._0_8_ = uVar33;
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = uVar15;
                  auVar77 = vpunpcklqdq_avx(auVar96,auVar77);
                  auVar67._8_8_ = 0;
                  auVar67._0_8_ = uVar18;
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = uVar17;
                  auVar67 = vpunpcklqdq_avx(auVar78,auVar67);
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = uVar31;
                  auVar88._8_8_ = 0;
                  auVar88._0_8_ = uVar16;
                  auVar78 = vpunpcklqdq_avx(auVar88,auVar79);
                  auVar75._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar78;
                  auVar75._16_16_ = ZEXT116(1) * auVar67;
                  auVar80._8_8_ = 0;
                  auVar80._0_8_ = uVar35;
                  auVar89._8_8_ = 0;
                  auVar89._0_8_ = uVar26;
                  auVar67 = vpunpcklqdq_avx(auVar80,auVar89);
                  auVar93._8_8_ = 0;
                  auVar93._0_8_ = uVar36;
                  auVar95._0_16_ = ZEXT116(0) * auVar93 + ZEXT116(1) * auVar67;
                  auVar95._16_16_ = ZEXT116(1) * auVar93;
                  auVar86._8_8_ = uVar34;
                  auVar86._0_8_ = uVar34;
                  auVar86._16_8_ = uVar34;
                  auVar86._24_8_ = uVar34;
                  auVar86 = vpblendd_avx2(auVar95,auVar86,0xc0);
                  *(undefined1 (*) [16])((long)*ptr + lVar29 + 0x10) = auVar77;
                  *(undefined1 (*) [16])((long)*ptr + lVar29) = auVar61;
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar29) = auVar86;
                  lVar29 = lVar29 + 0x20;
                } while (lVar20 != lVar29);
                auVar46._8_8_ = uVar26;
                auVar46._0_8_ = uVar26;
                auVar46._16_8_ = uVar26;
                auVar46._24_8_ = uVar26;
                auVar74 = vpunpcklqdq_avx2(auVar46,auVar95);
                uVar27 = ptr_00[uVar14 + 1];
                auVar74 = vpblendd_avx2(auVar74,ZEXT832(uVar27),3);
                auVar74 = vpaddq_avx2(auVar74,(undefined1  [32])*ptr_03);
                uVar28 = auVar74._0_8_;
                if ((long)auVar74._0_8_ < (long)uVar16) {
                  uVar28 = uVar16;
                }
                uVar15 = vpextrq_avx(auVar74._0_16_,1);
                if ((long)uVar15 < (long)uVar31) {
                  uVar15 = uVar31;
                }
                uVar33 = auVar74._16_8_;
                if ((long)auVar74._16_8_ < (long)uVar17) {
                  uVar33 = uVar17;
                }
                uVar16 = vpextrq_avx(auVar74._16_16_,1);
                uVar31 = uVar14 + 1;
                if ((long)uVar16 < (long)uVar18) {
                  uVar16 = uVar18;
                }
                auVar40._8_8_ = 0;
                auVar40._0_8_ = uVar16;
                auVar62._8_8_ = 0;
                auVar62._0_8_ = uVar33;
                auVar61 = vpunpcklqdq_avx(auVar62,auVar40);
                auVar63._8_8_ = 0;
                auVar63._0_8_ = uVar15;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = uVar28;
                auVar77 = vpunpcklqdq_avx(auVar68,auVar63);
                auVar65._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar77;
                auVar65._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
                iVar32 = 1;
                do {
                  auVar74 = vperm2i128_avx2(auVar65,auVar65,8);
                  auVar74 = vpalignr_avx2(auVar65,auVar74,8);
                  auVar74 = vpaddq_avx2(auVar51,auVar74);
                  uVar28 = auVar74._0_8_;
                  if ((long)auVar74._0_8_ < (long)auVar65._0_8_) {
                    uVar28 = auVar65._0_8_;
                  }
                  uVar33 = vpextrq_avx(auVar65._0_16_,1);
                  uVar15 = vpextrq_avx(auVar74._0_16_,1);
                  if ((long)uVar15 < (long)uVar33) {
                    uVar15 = uVar33;
                  }
                  uVar33 = auVar74._16_8_;
                  if ((long)auVar74._16_8_ < (long)auVar65._16_8_) {
                    uVar33 = auVar65._16_8_;
                  }
                  auVar69._8_8_ = 0;
                  auVar69._0_8_ = uVar15;
                  auVar81._8_8_ = 0;
                  auVar81._0_8_ = uVar28;
                  auVar61 = vpunpcklqdq_avx(auVar81,auVar69);
                  lVar30 = vpextrq_avx(auVar65._16_16_,1);
                  lVar29 = vpextrq_avx(auVar74._16_16_,1);
                  auVar90._8_8_ = 0;
                  auVar90._0_8_ = uVar33;
                  auVar87._0_16_ = ZEXT116(0) * auVar90 + ZEXT116(1) * auVar61;
                  auVar87._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar90;
                  if (lVar29 < lVar30) {
                    lVar29 = lVar30;
                  }
                  auVar47._8_8_ = lVar29;
                  auVar47._0_8_ = lVar29;
                  auVar47._16_8_ = lVar29;
                  auVar47._24_8_ = lVar29;
                  auVar65 = vpblendd_avx2(auVar87,auVar47,0xc0);
                  iVar32 = iVar32 + -1;
                } while (iVar32 == 0);
                auVar41._8_8_ = uVar15;
                auVar41._0_8_ = uVar15;
                auVar48._16_16_ = ZEXT116(1) * auVar41;
                auVar48._0_16_ = ZEXT116(0) * auVar41;
                auVar74 = vpalignr_avx2(auVar87,auVar48,8);
                auVar66 = vpaddq_avx2(ZEXT832(uVar24),auVar74);
                uVar28 = auVar66._0_8_;
                if ((long)auVar66._0_8_ < (long)uVar27) {
                  uVar28 = uVar27;
                }
                uVar27 = vpextrq_avx(auVar66._0_16_,1);
                if ((long)uVar27 < (long)uVar35) {
                  uVar27 = uVar35;
                }
                uVar15 = auVar66._16_8_;
                if ((long)auVar66._16_8_ < (long)uVar26) {
                  uVar15 = uVar26;
                }
                uVar33 = vpextrq_avx(auVar66._16_16_,1);
                if ((long)uVar33 < (long)uVar36) {
                  uVar33 = uVar36;
                }
                auVar42._8_8_ = 0;
                auVar42._0_8_ = uVar33;
                auVar70._8_8_ = 0;
                auVar70._0_8_ = uVar15;
                auVar61 = vpunpcklqdq_avx(auVar70,auVar42);
                auVar71._8_8_ = 0;
                auVar71._0_8_ = uVar27;
                auVar82._8_8_ = 0;
                auVar82._0_8_ = uVar28;
                auVar77 = vpunpcklqdq_avx(auVar82,auVar71);
                auVar76._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar77;
                auVar76._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
                lVar29 = 0;
                do {
                  auVar74 = vpsubq_avx2(auVar66,auVar50);
                  auVar86 = vpsubq_avx2(auVar76,auVar49);
                  uVar27 = auVar86._0_8_;
                  if ((long)auVar86._0_8_ < (long)auVar74._0_8_) {
                    uVar27 = auVar74._0_8_;
                  }
                  uVar15 = vpextrq_avx(auVar74._0_16_,1);
                  uVar28 = vpextrq_avx(auVar86._0_16_,1);
                  if ((long)uVar28 < (long)uVar15) {
                    uVar28 = uVar15;
                  }
                  uVar15 = auVar86._16_8_;
                  if ((long)auVar86._16_8_ < (long)auVar74._16_8_) {
                    uVar15 = auVar74._16_8_;
                  }
                  uVar16 = vpextrq_avx(auVar74._16_16_,1);
                  uVar33 = vpextrq_avx(auVar86._16_16_,1);
                  if ((long)uVar33 < (long)uVar16) {
                    uVar33 = uVar16;
                  }
                  uVar16 = *(ulong *)((long)*ptr_01 + lVar29);
                  uVar17 = uVar27;
                  if ((long)uVar27 < (long)uVar16) {
                    uVar17 = uVar16;
                  }
                  uVar16 = *(ulong *)((long)*ptr_01 + lVar29 + 8);
                  uVar18 = uVar28;
                  if ((long)uVar28 < (long)uVar16) {
                    uVar18 = uVar16;
                  }
                  uVar16 = *(ulong *)((long)*ptr_01 + lVar29 + 0x10);
                  uVar35 = uVar15;
                  if ((long)uVar15 < (long)uVar16) {
                    uVar35 = uVar16;
                  }
                  uVar16 = *(ulong *)((long)*ptr_01 + lVar29 + 0x18);
                  uVar26 = uVar33;
                  if ((long)uVar33 < (long)uVar16) {
                    uVar26 = uVar16;
                  }
                  auVar43._8_8_ = 0;
                  auVar43._0_8_ = uVar26;
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = uVar35;
                  auVar61 = vpunpcklqdq_avx(auVar72,auVar43);
                  auVar73._8_8_ = 0;
                  auVar73._0_8_ = uVar18;
                  auVar97._8_8_ = 0;
                  auVar97._0_8_ = uVar17;
                  auVar77 = vpunpcklqdq_avx(auVar97,auVar73);
                  auVar76._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar77;
                  auVar76._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar29) = auVar76;
                  uVar16 = auVar60._0_8_;
                  if ((long)uVar17 <= (long)auVar60._0_8_) {
                    uVar16 = uVar17;
                  }
                  uVar36 = vpextrq_avx(auVar60._0_16_,1);
                  if ((long)uVar18 <= (long)uVar36) {
                    uVar36 = uVar18;
                  }
                  auVar91._8_8_ = 0;
                  auVar91._0_8_ = uVar33;
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = uVar15;
                  auVar61 = vpunpcklqdq_avx(auVar94,auVar91);
                  uVar15 = auVar60._16_8_;
                  if ((long)uVar35 <= (long)auVar60._16_8_) {
                    uVar15 = uVar35;
                  }
                  uVar33 = vpextrq_avx(auVar60._16_16_,1);
                  auVar64._8_8_ = 0;
                  auVar64._0_8_ = uVar28;
                  auVar83._8_8_ = 0;
                  auVar83._0_8_ = uVar27;
                  auVar77 = vpunpcklqdq_avx(auVar83,auVar64);
                  if ((long)uVar26 <= (long)uVar33) {
                    uVar33 = uVar26;
                  }
                  auVar66._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar77;
                  auVar66._16_16_ = ZEXT116(1) * auVar61;
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = uVar33;
                  auVar56._8_8_ = 0;
                  auVar56._0_8_ = uVar15;
                  auVar61 = vpunpcklqdq_avx(auVar56,auVar44);
                  if ((long)uVar17 < (long)auVar55._0_8_) {
                    uVar17 = auVar55._0_8_;
                  }
                  uVar27 = vpextrq_avx(auVar55._0_16_,1);
                  auVar57._8_8_ = 0;
                  auVar57._0_8_ = uVar36;
                  auVar84._8_8_ = 0;
                  auVar84._0_8_ = uVar16;
                  auVar77 = vpunpcklqdq_avx(auVar84,auVar57);
                  if ((long)uVar18 < (long)uVar27) {
                    uVar18 = uVar27;
                  }
                  auVar59._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar77;
                  auVar59._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
                  auVar60 = ZEXT3264(auVar59);
                  if ((long)uVar35 < (long)auVar55._16_8_) {
                    uVar35 = auVar55._16_8_;
                  }
                  uVar27 = vpextrq_avx(auVar55._16_16_,1);
                  if ((long)uVar26 < (long)uVar27) {
                    uVar26 = uVar27;
                  }
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = uVar26;
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = uVar35;
                  auVar61 = vpunpcklqdq_avx(auVar52,auVar45);
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = uVar18;
                  auVar85._8_8_ = 0;
                  auVar85._0_8_ = uVar17;
                  auVar77 = vpunpcklqdq_avx(auVar85,auVar53);
                  auVar54._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar77;
                  auVar54._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
                  auVar55 = ZEXT3264(auVar54);
                  lVar29 = lVar29 + 0x20;
                } while (lVar20 != lVar29);
                alVar4 = ptr_02[(uint)(iVar22 % iVar12)];
                auVar61 = alVar4._16_16_;
                iVar32 = iVar13;
                if (iVar8 < 3) {
                  do {
                    auVar74 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                    alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar74,8);
                    auVar61 = alVar4._16_16_;
                    iVar32 = iVar32 + -1;
                  } while (iVar32 != 0);
                }
                ((ppVar11->field_4).rowcols)->score_row[uVar14] = auVar61._8_4_;
                uVar14 = uVar31;
              } while (uVar31 != uVar25);
              lVar20 = 0;
              do {
                piVar3 = ((ppVar11->field_4).rowcols)->score_col;
                lVar5 = (*ptr_02 + lVar20)[1];
                lVar6 = (*ptr_02)[lVar20 + 2];
                lVar7 = (*ptr_02 + lVar20 + 2)[1];
                *(int *)((long)piVar3 + lVar20) = (int)(*ptr_02)[lVar20];
                *(int *)((long)piVar3 + size * 4 + lVar20) = (int)lVar5;
                *(int *)((long)piVar3 + size * 8 + lVar20) = (int)lVar6;
                *(int *)((long)piVar3 + size * 0xc + lVar20) = (int)lVar7;
                lVar20 = lVar20 + 4;
              } while ((ulong)(iVar12 + (uint)(iVar12 == 0)) << 2 != lVar20);
              alVar4 = ptr_02[(uint)(iVar22 % iVar12)];
              auVar38 = alVar4._16_16_;
              if (iVar8 < 3) {
                iVar13 = 1;
                if (1 < iVar10) {
                  iVar13 = iVar10;
                }
                do {
                  auVar51 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                  alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar51,8);
                  auVar38 = alVar4._16_16_;
                  iVar13 = iVar13 + -1;
                } while (iVar13 != 0);
              }
              auVar51 = vpcmpgtq_avx2(auVar39,auVar59);
              auVar39 = vpcmpgtq_avx2(auVar54,auVar58);
              auVar51 = vpor_avx2(auVar39,auVar51);
              if ((((auVar51 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   SUB321(auVar51 >> 0x7f,0) == '\0') && SUB321(auVar51 >> 0xbf,0) == '\0') &&
                  -1 < auVar51[0x1f]) {
                uVar19 = vpextrq_avx(auVar38,1);
                iVar13 = (int)uVar19;
              }
              else {
                *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
                iVar13 = 0;
                iVar9 = 0;
                iVar22 = 0;
              }
              ppVar11->score = iVar13;
              ppVar11->end_query = iVar22;
              ppVar11->end_ref = iVar9;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar11;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}